

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int flow_get_next_outgoing_id(FLOW_HANDLE flow,transfer_number *next_outgoing_id_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint local_1c;
  
  if (flow == (FLOW_HANDLE)0x0) {
    iVar3 = 0x1792;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(flow->composite_value,&local_1c);
    iVar3 = 0x179a;
    if ((iVar1 == 0) && (iVar3 = 0x17a0, 2 < local_1c)) {
      value = amqpvalue_get_composite_item_in_place(flow->composite_value,2);
      iVar3 = 0x17a8;
      if ((value != (AMQP_VALUE)0x0) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)
         ) {
        iVar1 = amqpvalue_get_uint(value,next_outgoing_id_value);
        iVar3 = 0x17af;
        if (iVar1 == 0) {
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int flow_get_next_outgoing_id(FLOW_HANDLE flow, transfer_number* next_outgoing_id_value)
{
    int result;

    if (flow == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)flow;
        if (amqpvalue_get_composite_item_count(flow_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 2)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(flow_instance->composite_value, 2);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_transfer_number(item_value, next_outgoing_id_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}